

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

int __thiscall
ctemplate::TemplateCache::Refcount(TemplateCache *this,TemplateCacheKey template_cache_key)

{
  int iVar1;
  Mutex *pMVar2;
  int iVar3;
  iterator iVar4;
  key_type local_18;
  
  local_18.first = template_cache_key.first;
  pMVar2 = this->mutex_;
  iVar3 = pMVar2->mutex_;
  pMVar2->mutex_ = iVar3 + 1;
  if (iVar3 < 0) {
    __assert_fail("++mutex_ > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xef,"void ctemplate::Mutex::ReaderLock()");
  }
  local_18.second = template_cache_key.second;
  iVar4 = std::
          _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->parsed_template_cache_->_M_h,&local_18);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = RefcountedTemplate::refcount
                      (*(RefcountedTemplate **)
                        ((long)iVar4.
                               super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                               ._M_cur + 0x18));
  }
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = iVar1 + -1;
  if (0 < iVar1) {
    return iVar3;
  }
  __assert_fail("mutex_-- > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                ,0xf0,"void ctemplate::Mutex::ReaderUnlock()");
}

Assistant:

int TemplateCache::Refcount(const TemplateCacheKey template_cache_key) const {
  ReaderMutexLock ml(mutex_);
  CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
  return it ? it->refcounted_tpl->refcount() : 0;
}